

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O0

void __thiscall
irr::core::array<irr::video::COpenGL3MaterialRenderer::SUniformInfo>::reallocate
          (array<irr::video::COpenGL3MaterialRenderer::SUniformInfo> *this,u32 new_size,
          bool canShrink)

{
  size_type sVar1;
  byte in_DL;
  uint in_ESI;
  vector<irr::video::COpenGL3MaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGL3MaterialRenderer::SUniformInfo>_>
  *in_RDI;
  vector<irr::video::COpenGL3MaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGL3MaterialRenderer::SUniformInfo>_>
  *unaff_retaddr;
  size_t allocated;
  undefined3 in_stack_00000018;
  
  sVar1 = ::std::
          vector<irr::video::COpenGL3MaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGL3MaterialRenderer::SUniformInfo>_>
          ::capacity(in_RDI);
  if (in_ESI < sVar1) {
    if ((in_DL & 1) != 0) {
      ::std::
      vector<irr::video::COpenGL3MaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGL3MaterialRenderer::SUniformInfo>_>
      ::resize(unaff_retaddr,(size_type)in_RDI);
    }
  }
  else {
    ::std::
    vector<irr::video::COpenGL3MaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGL3MaterialRenderer::SUniformInfo>_>
    ::reserve(&this->m_data,CONCAT44(new_size,_in_stack_00000018));
  }
  return;
}

Assistant:

void reallocate(u32 new_size, bool canShrink = true)
	{
		size_t allocated = m_data.capacity();
		if (new_size < allocated) {
			if (canShrink)
				m_data.resize(new_size);
		} else {
			m_data.reserve(new_size);
		}
	}